

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

bool __thiscall QAbstractScrollArea::event(QAbstractScrollArea *this,QEvent *e)

{
  ushort uVar1;
  long lVar2;
  QAbstractScrollAreaPrivate *this_00;
  QWidget *pQVar3;
  QScrollBar *this_01;
  long lVar4;
  QAbstractSlider *pQVar5;
  QAbstractSlider *pQVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  QAbstractScrollAreaPrivate *d_3;
  QPanGesture *this_02;
  QStyle *pQVar13;
  QPoint QVar14;
  QPoint QVar15;
  QSize QVar16;
  QAbstractScrollAreaPrivate *d;
  ulong uVar17;
  QScrollEvent *se;
  QAbstractScrollAreaPrivate *d_1;
  long in_FS_OFFSET;
  QPointF QVar18;
  double local_98;
  QPainter p;
  QStyleOption option;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractScrollAreaPrivate **)(this + 8);
  uVar1 = *(ushort *)(e + 8);
  bVar9 = false;
  uVar17 = (ulong)(uVar1 - 0x1f);
  if (uVar1 - 0x1f < 0x3c) {
    if ((0x1e0000001U >> (uVar17 & 0x3f) & 1) == 0) {
      if ((0x800200000000040U >> (uVar17 & 0x3f) & 1) == 0) {
        if (uVar17 != 0x33) goto LAB_0036fa6c;
        if (e[0x38] != (QEvent)0x1) {
          e[0xc] = (QEvent)0x0;
          goto LAB_0036fdf6;
        }
      }
      else {
LAB_0036fb9a:
        QAbstractScrollAreaPrivate::layoutChildren(this_00);
      }
      goto switchD_0036f96d_caseD_c5;
    }
    goto switchD_0036f96d_caseD_c2;
  }
LAB_0036fa6c:
  switch(uVar1) {
  case 2:
  case 3:
  case 4:
  case 5:
    break;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xd:
  case 0xf:
  case 0x10:
    goto switchD_0036f96d_caseD_c5;
  case 0xc:
    option.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    option._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    option.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption(&option,1,0);
    QStyleOption::initFrom(&option,(QWidget *)this);
    if (((this_00->cornerPaintingRect).x1.m_i <= (this_00->cornerPaintingRect).x2.m_i) &&
       ((this_00->cornerPaintingRect).y1.m_i <= (this_00->cornerPaintingRect).y2.m_i)) {
      option.rect.x1.m_i = (this_00->cornerPaintingRect).x1.m_i;
      option.rect.y1.m_i = (this_00->cornerPaintingRect).y1.m_i;
      option.rect.x2.m_i = (this_00->cornerPaintingRect).x2.m_i;
      option.rect.y2.m_i = (this_00->cornerPaintingRect).y2.m_i;
      _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter(&p,(QPaintDevice *)(this + 0x10));
      pQVar13 = QWidget::style((QWidget *)this);
      (**(code **)(*(long *)pQVar13 + 0xb0))(pQVar13,0x28,&option,&p,this);
      QPainter::~QPainter(&p);
    }
    QStyleOption::~QStyleOption(&option);
    QFrame::paintEvent((QFrame *)this,(QPaintEvent *)e);
    goto LAB_0036fdf6;
  case 0xe:
    bVar9 = true;
    if (this_00->inResize == false) {
      this_00->inResize = true;
      QAbstractScrollAreaPrivate::layoutChildren(this_00);
      this_00->inResize = false;
    }
    break;
  case 0x11:
    if ((this_00->shownOnce == false) && (this_00->sizeAdjustPolicy == AdjustToContentsOnFirstShow))
    {
      (this_00->sizeHint).wd = -1;
      (this_00->sizeHint).ht = -1;
      QWidget::updateGeometry((QWidget *)this);
    }
    this_00->shownOnce = true;
    goto switchD_0036f96d_caseD_c5;
  default:
    bVar9 = false;
    switch(uVar1) {
    case 0xc2:
    case 0xc3:
    case 0xc4:
      break;
    case 0xc5:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
      goto switchD_0036f96d_caseD_c5;
    case 0xc6:
      this_02 = (QPanGesture *)QGestureEvent::gesture((QGestureEvent *)e,PanGesture);
      if (this_02 == (QPanGesture *)0x0) {
LAB_0036fdd9:
        bVar9 = false;
      }
      else {
        pQVar5 = *(QAbstractSlider **)(*(long *)(this + 8) + 0x288);
        pQVar6 = *(QAbstractSlider **)(*(long *)(this + 8) + 0x290);
        QVar18 = QPanGesture::delta(this_02);
        local_98 = QVar18.xp;
        bVar9 = true;
        dVar7 = QVar18.yp;
        if ((((local_98 != 0.0) || (NAN(local_98))) || (dVar7 != 0.0)) || (NAN(dVar7))) {
          bVar8 = QGuiApplication::isRightToLeft();
          if (bVar8) {
            local_98 = -local_98;
          }
          iVar11 = QAbstractSlider::value(pQVar5);
          iVar12 = QAbstractSlider::value(pQVar6);
          QAbstractSlider::setValue(pQVar5,(int)((double)iVar11 - local_98));
          QAbstractSlider::setValue(pQVar6,(int)((double)iVar12 - dVar7));
        }
      }
      break;
    case 0xcc:
      option._0_8_ = *(undefined8 *)(e + 0x40);
      option._8_8_ = *(undefined8 *)(e + 0x48);
      _p = QPointF::toPoint((QPointF *)&option);
      cVar10 = (**(code **)(*(long *)&(this_00->super_QFramePrivate).super_QWidgetPrivate + 0xb0))
                         (this_00);
      if (cVar10 == '\0') goto LAB_0036fdd9;
      lVar4 = *(long *)(this + 8);
      pQVar5 = *(QAbstractSlider **)(lVar4 + 0x288);
      pQVar6 = *(QAbstractSlider **)(lVar4 + 0x290);
      QVar16 = QWidget::size(*(QWidget **)(lVar4 + 0x2b0));
      option._0_8_ = (BADTYPE)QVar16.wd.m_i.m_i;
      option._8_8_ = (BADTYPE)QVar16.ht.m_i.m_i;
      QScrollPrepareEvent::setViewportSize((QSizeF *)e);
      iVar11 = QAbstractSlider::maximum(pQVar5);
      iVar12 = QAbstractSlider::maximum(pQVar6);
      option.rect._8_8_ = (BADTYPE)iVar12;
      option.version = 0;
      option.type = 0;
      option.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
      option.direction = LeftToRight;
      option.rect._0_8_ = (double)iVar11;
      QScrollPrepareEvent::setContentPosRange((QRectF *)e);
      iVar11 = QAbstractSlider::value(pQVar5);
      iVar12 = QAbstractSlider::value(pQVar6);
      option._8_8_ = (BADTYPE)iVar12;
      option._0_8_ = (double)iVar11;
      QScrollPrepareEvent::setContentPos((QPointF *)e);
      e[0xc] = (QEvent)0x1;
      goto LAB_0036fdf6;
    case 0xcd:
      this_01 = this_00->vbar;
      QAbstractSlider::setValue(&this_00->hbar->super_QAbstractSlider,(int)*(double *)(e + 0x10));
      QAbstractSlider::setValue(&this_01->super_QAbstractSlider,(int)*(double *)(e + 0x18));
      option._0_8_ = *(undefined8 *)(e + 0x20);
      option._8_8_ = *(undefined8 *)(e + 0x28);
      QVar14 = QPointF::toPoint((QPointF *)&option);
      iVar11 = (this_00->overshoot).xp.m_i;
      iVar12 = (this_00->overshoot).yp.m_i;
      if (iVar12 != QVar14.yp.m_i.m_i || iVar11 != QVar14.xp.m_i.m_i) {
        pQVar3 = *(QWidget **)(*(long *)(this + 8) + 0x2b0);
        QVar15 = QWidget::pos(pQVar3);
        option.version = QVar15.xp.m_i.m_i + (iVar11 - QVar14.xp.m_i);
        option.type = QVar15.yp.m_i.m_i + (iVar12 - QVar14.yp.m_i);
        QWidget::move(pQVar3,(QPoint *)&option);
      }
      option._0_8_ = *(undefined8 *)(e + 0x20);
      option._8_8_ = *(undefined8 *)(e + 0x28);
      QVar14 = QPointF::toPoint((QPointF *)&option);
      this_00->overshoot = QVar14;
LAB_0036fdf6:
      bVar9 = true;
      break;
    default:
      if (uVar1 == 100) goto LAB_0036fb9a;
      if (uVar1 == 0x6d) {
        QWidget::setMouseTracking
                  (this_00->viewport,SUB41((*(uint *)(*(long *)(this + 0x20) + 8) & 4) >> 2,0));
        goto LAB_0036fdf6;
      }
      if (uVar1 != 0x98) goto switchD_0036f96d_caseD_c5;
      pQVar3 = this_00->viewport;
      bVar9 = true;
      if (pQVar3 != (QWidget *)0x0) {
        bVar8 = QWidget::acceptDrops((QWidget *)this);
        QWidget::setAcceptDrops(pQVar3,bVar8);
      }
    }
  }
switchD_0036f96d_caseD_c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar9;
  }
LAB_0036fe18:
  __stack_chk_fail();
switchD_0036f96d_caseD_c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    bVar9 = QFrame::event((QFrame *)this,e);
    return bVar9;
  }
  goto LAB_0036fe18;
}

Assistant:

bool QAbstractScrollArea::event(QEvent *e)
{
    Q_D(QAbstractScrollArea);
    switch (e->type()) {
    case QEvent::AcceptDropsChange:
        // There was a chance that with accessibility client we get an
        // event before the viewport was created.
        // Also, in some cases we might get here from QWidget::event() virtual function which is (indirectly) called
        // from the viewport constructor at the time when the d->viewport is not yet initialized even without any
        // accessibility client. See qabstractscrollarea autotest for a test case.
        if (d->viewport)
            d->viewport->setAcceptDrops(acceptDrops());
        break;
    case QEvent::MouseTrackingChange:
        d->viewport->setMouseTracking(hasMouseTracking());
        break;
    case QEvent::Resize:
        if (!d->inResize) {
            d->inResize = true;
            d->layoutChildren();
            d->inResize = false;
        }
        break;
    case QEvent::Show:
        if (!d->shownOnce && d->sizeAdjustPolicy == QAbstractScrollArea::AdjustToContentsOnFirstShow) {
            d->sizeHint = QSize();
            updateGeometry();
        }
        d->shownOnce = true;
        return QFrame::event(e);
    case QEvent::Paint: {
        QStyleOption option;
        option.initFrom(this);
        if (d->cornerPaintingRect.isValid()) {
            option.rect = d->cornerPaintingRect;
            QPainter p(this);
            style()->drawPrimitive(QStyle::PE_PanelScrollAreaCorner, &option, &p, this);
        }
        }
        QFrame::paintEvent((QPaintEvent*)e);
        break;
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard)
           return QFrame::event(e);
        e->ignore();
        break;
#endif // QT_NO_CONTEXTMENU
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::Wheel:
#if QT_CONFIG(draganddrop)
    case QEvent::Drop:
    case QEvent::DragEnter:
    case QEvent::DragMove:
    case QEvent::DragLeave:
#endif
        // ignore touch events in case they have been propagated from the viewport
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        return false;
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    {
        QGestureEvent *ge = static_cast<QGestureEvent *>(e);
        QPanGesture *g = static_cast<QPanGesture *>(ge->gesture(Qt::PanGesture));
        if (g) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPointF delta = g->delta();
            if (!delta.isNull()) {
                if (QGuiApplication::isRightToLeft())
                    delta.rx() *= -1;
                int newX = hBar->value() - delta.x();
                int newY = vBar->value() - delta.y();
                hBar->setValue(newX);
                vBar->setValue(newY);
            }
            return true;
        }
        return false;
    }
#endif // QT_NO_GESTURES
    case QEvent::ScrollPrepare:
    {
        QScrollPrepareEvent *se = static_cast<QScrollPrepareEvent *>(e);
        if (d->canStartScrollingAt(se->startPos().toPoint())) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();

            se->setViewportSize(QSizeF(viewport()->size()));
            se->setContentPosRange(QRectF(0, 0, hBar->maximum(), vBar->maximum()));
            se->setContentPos(QPointF(hBar->value(), vBar->value()));
            se->accept();
            return true;
        }
        return false;
    }
    case QEvent::Scroll:
    {
        QScrollEvent *se = static_cast<QScrollEvent *>(e);

        QScrollBar *hBar = horizontalScrollBar();
        QScrollBar *vBar = verticalScrollBar();
        hBar->setValue(se->contentPos().x());
        vBar->setValue(se->contentPos().y());

        QPoint delta = d->overshoot - se->overshootDistance().toPoint();
        if (!delta.isNull())
            viewport()->move(viewport()->pos() + delta);

        d->overshoot = se->overshootDistance().toPoint();

        return true;
    }
    case QEvent::StyleChange:
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutRequest:
        d->layoutChildren();
        Q_FALLTHROUGH();
    default:
        return QFrame::event(e);
    }
    return true;
}